

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_deposit_i32_arm
               (TCGContext_conflict *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2,uint ofs,
               uint len)

{
  TCGOp *pTVar1;
  TCGv_i32 ret_00;
  uint arg2_00;
  uintptr_t o;
  uintptr_t o_1;
  
  if (len == 0x20) {
    tcg_gen_mov_i32(tcg_ctx,ret,arg2);
    return;
  }
  if (len == 0x10 && ofs == 0 || (ofs == 8 || ofs == 0) && len == 8) {
    pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_deposit_i32);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = (TCGArg)(arg1 + (long)tcg_ctx);
    pTVar1->args[2] = (TCGArg)(arg2 + (long)tcg_ctx);
    pTVar1->args[3] = (ulong)ofs;
    pTVar1->args[4] = (ulong)len;
    return;
  }
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  if (len + ofs == 0x20) {
    tcg_gen_shli_i32_arm(tcg_ctx,ret_00,arg1,len);
    tcg_gen_extract2_i32_arm(tcg_ctx,ret,ret_00,arg2,len);
  }
  else if (ofs == 0) {
    tcg_gen_extract2_i32_arm(tcg_ctx,ret,arg1,arg2,len);
    tcg_gen_rotli_i32_arm(tcg_ctx,ret,ret,len);
  }
  else {
    arg2_00 = ~(-1 << ((byte)len & 0x1f));
    tcg_gen_andi_i32_arm(tcg_ctx,ret_00,arg2,arg2_00);
    tcg_gen_shli_i32_arm(tcg_ctx,ret_00,ret_00,ofs);
    tcg_gen_andi_i32_arm(tcg_ctx,ret,arg1,~(arg2_00 << ((byte)ofs & 0x1f)));
    tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
  }
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_deposit_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2,
                         unsigned int ofs, unsigned int len)
{
    uint32_t mask;
    TCGv_i32 t1;

    tcg_debug_assert(ofs < 32);
    tcg_debug_assert(len > 0);
    tcg_debug_assert(len <= 32);
    tcg_debug_assert(ofs + len <= 32);

    if (len == 32) {
        tcg_gen_mov_i32(tcg_ctx, ret, arg2);
        return;
    }
    if (TCG_TARGET_HAS_deposit_i32 && TCG_TARGET_deposit_i32_valid(ofs, len)) {
        tcg_gen_op5ii_i32(tcg_ctx, INDEX_op_deposit_i32, ret, arg1, arg2, ofs, len);
        return;
    }

    t1 = tcg_temp_new_i32(tcg_ctx);

    if (TCG_TARGET_HAS_extract2_i32) {
        if (ofs + len == 32) {
            tcg_gen_shli_i32(tcg_ctx, t1, arg1, len);
            tcg_gen_extract2_i32(tcg_ctx, ret, t1, arg2, len);
            goto done;
        }
        if (ofs == 0) {
            tcg_gen_extract2_i32(tcg_ctx, ret, arg1, arg2, len);
            tcg_gen_rotli_i32(tcg_ctx, ret, ret, len);
            goto done;
        }
    }

    mask = (1u << len) - 1;
    if (ofs + len < 32) {
        tcg_gen_andi_i32(tcg_ctx, t1, arg2, mask);
        tcg_gen_shli_i32(tcg_ctx, t1, t1, ofs);
    } else {
        tcg_gen_shli_i32(tcg_ctx, t1, arg2, ofs);
    }
    tcg_gen_andi_i32(tcg_ctx, ret, arg1, ~(mask << ofs));
    tcg_gen_or_i32(tcg_ctx, ret, ret, t1);
 done:
    tcg_temp_free_i32(tcg_ctx, t1);
}